

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GPrim *gprim,uint32_t indent,
          bool closing_brace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  uint32_t n;
  Specifier s;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t uVar3;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  stringstream ss;
  char local_1fc;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)gprim & 0xffffffff),n);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," GPrim \"",8);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)(this + 0xa78),*(long *)(this + 0xa80));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  uVar3 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    uVar3 = extraout_EDX_00;
  }
  paVar1 = &local_1f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    uVar3 = extraout_EDX_01;
  }
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)gprim & 0xffffffff),uVar3);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(\n",2);
  uVar3 = extraout_EDX_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    uVar3 = extraout_EDX_03;
  }
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)gprim & 0xffffffff),uVar3);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
  uVar3 = extraout_EDX_04;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    uVar3 = extraout_EDX_05;
  }
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)gprim & 0xffffffff),uVar3);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  print_gprim_predefined<tinyusdz::GPrim>(&local_1f8,(GPrim *)this,(int)gprim + 1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  uVar3 = extraout_EDX_06;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    uVar3 = extraout_EDX_07;
  }
  local_1fc = (char)indent;
  if (local_1fc != '\0') {
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)gprim & 0xffffffff),uVar3);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GPrim &gprim, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(gprim.spec) << " GPrim \""
     << gprim.name << "\"\n";
  ss << pprint::Indent(indent) << "(\n";
  // args
  ss << pprint::Indent(indent) << ")\n";
  ss << pprint::Indent(indent) << "{\n";

  ss << print_gprim_predefined(gprim, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}